

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_array.c
# Opt level: O3

ares_status_t ares_array_insertdata_at(ares_array_t *arr,size_t idx,void *data_ptr)

{
  ares_status_t aVar1;
  void *ptr;
  void *local_20;
  
  local_20 = (void *)0x0;
  aVar1 = ares_array_insert_at(&local_20,arr,idx);
  if (aVar1 == ARES_SUCCESS) {
    memcpy(local_20,data_ptr,arr->member_size);
  }
  return aVar1;
}

Assistant:

ares_status_t ares_array_insertdata_at(ares_array_t *arr, size_t idx,
                                       const void *data_ptr)
{
  ares_status_t status;
  void         *ptr = NULL;

  status = ares_array_insert_at(&ptr, arr, idx);
  if (status != ARES_SUCCESS) {
    return status;
  }
  memcpy(ptr, data_ptr, arr->member_size);
  return ARES_SUCCESS;
}